

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_find_sibling_opaq_next(lyd_node *first,char *name,lyd_node **match)

{
  lyd_node *plVar1;
  int iVar2;
  
  if (name == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name",
           "lyd_find_sibling_opaq_next");
    return LY_EINVAL;
  }
  if (first != (lyd_node *)0x0) {
    if (first->schema == (lysc_node *)0x0) goto LAB_001244d3;
    plVar1 = first->prev;
    if (first->prev->schema == (lysc_node *)0x0) {
      do {
        first = plVar1;
        plVar1 = first->prev;
      } while (first->prev->schema == (lysc_node *)0x0);
      goto LAB_001244d3;
    }
  }
  first = (lyd_node *)0x0;
LAB_001244d3:
  for (; first != (lyd_node *)0x0; first = first->next) {
    if (first->schema != (lysc_node *)0x0) {
      __assert_fail("!first->schema",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                    ,0xcce,
                    "LY_ERR lyd_find_sibling_opaq_next(const struct lyd_node *, const char *, struct lyd_node **)"
                   );
    }
    iVar2 = strcmp((char *)first[1].schema,name);
    if (iVar2 == 0) break;
  }
  if (match != (lyd_node **)0x0) {
    *match = first;
  }
  return (uint)(first == (lyd_node *)0x0) * 5;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_find_sibling_opaq_next(const struct lyd_node *first, const char *name, struct lyd_node **match)
{
    LY_CHECK_ARG_RET(NULL, name, LY_EINVAL);

    if (first && first->schema) {
        first = first->prev;
        if (first->schema) {
            /* no opaque nodes */
            first = NULL;
        } else {
            /* opaque nodes are at the end, find quickly the first */
            while (!first->prev->schema) {
                first = first->prev;
            }
        }
    }

    for ( ; first; first = first->next) {
        assert(!first->schema);
        if (!strcmp(LYD_NAME(first), name)) {
            break;
        }
    }

    if (match) {
        *match = (struct lyd_node *)first;
    }
    return first ? LY_SUCCESS : LY_ENOTFOUND;
}